

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_types.cpp
# Opt level: O3

void __thiscall
duckdb_parquet::ColumnCryptoMetaData::__set_ENCRYPTION_WITH_COLUMN_KEY
          (ColumnCryptoMetaData *this,EncryptionWithColumnKey *val)

{
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=(&(this->ENCRYPTION_WITH_COLUMN_KEY).path_in_schema.
               super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ,&(val->path_in_schema).
                super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             );
  std::__cxx11::string::_M_assign((string *)&(this->ENCRYPTION_WITH_COLUMN_KEY).key_metadata);
  (this->ENCRYPTION_WITH_COLUMN_KEY).__isset = val->__isset;
  this->__isset = (_ColumnCryptoMetaData__isset)((byte)this->__isset | 2);
  return;
}

Assistant:

void ColumnCryptoMetaData::__set_ENCRYPTION_WITH_COLUMN_KEY(const EncryptionWithColumnKey& val) {
  this->ENCRYPTION_WITH_COLUMN_KEY = val;
__isset.ENCRYPTION_WITH_COLUMN_KEY = true;
}